

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FailoverStrategy.cpp
# Opt level: O0

void __thiscall
xmrig::FailoverStrategy::FailoverStrategy
          (FailoverStrategy *this,vector<xmrig::Pool,_std::allocator<xmrig::Pool>_> *pools,
          int retryPause,int retries,IStrategyListener *listener,bool quiet)

{
  bool bVar1;
  undefined4 in_ECX;
  undefined4 in_EDX;
  undefined8 in_RSI;
  vector<xmrig::Pool,_std::allocator<xmrig::Pool>_> *in_RDI;
  pointer in_R8;
  byte in_R9B;
  Pool *pool;
  const_iterator __end1;
  const_iterator __begin1;
  vector<xmrig::Pool,_std::allocator<xmrig::Pool>_> *__range1;
  vector<xmrig::Pool,_std::allocator<xmrig::Pool>_> *__lhs;
  Pool *in_stack_ffffffffffffffa8;
  FailoverStrategy *in_stack_ffffffffffffffb0;
  __normal_iterator<const_xmrig::Pool_*,_std::vector<xmrig::Pool,_std::allocator<xmrig::Pool>_>_>
  local_38;
  undefined8 local_30;
  byte local_21;
  pointer local_20;
  undefined4 local_18;
  undefined4 local_14;
  undefined8 local_10;
  
  local_21 = in_R9B & 1;
  local_20 = in_R8;
  local_18 = in_ECX;
  local_14 = in_EDX;
  local_10 = in_RSI;
  IStrategy::IStrategy((IStrategy *)in_RDI);
  IClientListener::IClientListener
            ((IClientListener *)
             &(in_RDI->super__Vector_base<xmrig::Pool,_std::allocator<xmrig::Pool>_>)._M_impl.
              super__Vector_impl_data._M_finish);
  (in_RDI->super__Vector_base<xmrig::Pool,_std::allocator<xmrig::Pool>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__FailoverStrategy_002b73c0;
  (in_RDI->super__Vector_base<xmrig::Pool,_std::allocator<xmrig::Pool>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)&DAT_002b7440;
  *(byte *)&(in_RDI->super__Vector_base<xmrig::Pool,_std::allocator<xmrig::Pool>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage = local_21 & 1;
  *(undefined4 *)
   ((long)&(in_RDI->super__Vector_base<xmrig::Pool,_std::allocator<xmrig::Pool>_>)._M_impl.
           super__Vector_impl_data._M_end_of_storage + 4) = local_18;
  *(undefined4 *)
   &in_RDI[1].super__Vector_base<xmrig::Pool,_std::allocator<xmrig::Pool>_>._M_impl.
    super__Vector_impl_data._M_start = local_14;
  *(undefined4 *)
   ((long)&in_RDI[1].super__Vector_base<xmrig::Pool,_std::allocator<xmrig::Pool>_>._M_impl.
           super__Vector_impl_data._M_start + 4) = 0xffffffff;
  in_RDI[1].super__Vector_base<xmrig::Pool,_std::allocator<xmrig::Pool>_>._M_impl.
  super__Vector_impl_data._M_finish = local_20;
  in_RDI[1].super__Vector_base<xmrig::Pool,_std::allocator<xmrig::Pool>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __lhs = in_RDI + 2;
  std::vector<xmrig::IClient_*,_std::allocator<xmrig::IClient_*>_>::vector
            ((vector<xmrig::IClient_*,_std::allocator<xmrig::IClient_*>_> *)0x1d290f);
  local_30 = local_10;
  local_38._M_current =
       (Pool *)std::vector<xmrig::Pool,_std::allocator<xmrig::Pool>_>::begin(in_RDI);
  std::vector<xmrig::Pool,_std::allocator<xmrig::Pool>_>::end(in_RDI);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_xmrig::Pool_*,_std::vector<xmrig::Pool,_std::allocator<xmrig::Pool>_>_>
                        *)__lhs,(__normal_iterator<const_xmrig::Pool_*,_std::vector<xmrig::Pool,_std::allocator<xmrig::Pool>_>_>
                                 *)in_RDI);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<const_xmrig::Pool_*,_std::vector<xmrig::Pool,_std::allocator<xmrig::Pool>_>_>
    ::operator*(&local_38);
    add(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    __gnu_cxx::
    __normal_iterator<const_xmrig::Pool_*,_std::vector<xmrig::Pool,_std::allocator<xmrig::Pool>_>_>
    ::operator++(&local_38);
  }
  return;
}

Assistant:

xmrig::FailoverStrategy::FailoverStrategy(const std::vector<Pool> &pools, int retryPause, int retries, IStrategyListener *listener, bool quiet) :
    m_quiet(quiet),
    m_retries(retries),
    m_retryPause(retryPause),
    m_active(-1),
    m_listener(listener),
    m_index(0)
{
    for (const Pool &pool : pools) {
        add(pool);
    }
}